

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * unpack9_16(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint *puVar2;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in & 0x1ff;
  *out = base + *out;
  puVar1 = out + 1;
  *puVar1 = *in >> 9 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 2;
  *puVar1 = *in >> 0x12 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 3;
  *puVar1 = *in >> 0x1b;
  puVar2 = in + 1;
  *puVar1 = (*puVar2 & 0xf) << 5 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 4;
  *puVar1 = *puVar2 >> 4 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 5;
  *puVar1 = *puVar2 >> 0xd & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 6;
  *puVar1 = *puVar2 >> 0x16 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 7;
  *puVar1 = *puVar2 >> 0x1f;
  puVar2 = in + 2;
  *puVar1 = (*puVar2 & 0xff) << 1 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 8;
  *puVar1 = *puVar2 >> 8 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 9;
  *puVar1 = *puVar2 >> 0x11 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 10;
  *puVar1 = *puVar2 >> 0x1a;
  puVar2 = in + 3;
  *puVar1 = (*puVar2 & 7) << 6 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xb;
  *puVar1 = *puVar2 >> 3 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xc;
  *puVar1 = *puVar2 >> 0xc & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xd;
  *puVar1 = *puVar2 >> 0x15 & 0x1ff;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xe;
  *puVar1 = *puVar2 >> 0x1e;
  *puVar1 = (in[4] & 0x7f) << 2 | *puVar1;
  *puVar1 = base + *puVar1;
  puVar1 = out + 0xf;
  *puVar1 = in[4] >> 7 & 0x1ff;
  *puVar1 = base + *puVar1;
  return in + 5;
}

Assistant:

uint32_t * unpack9_16( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  9  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  18  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  27  ) ;
    ++in;
    *out |= ((*in) % (1U<< 4 ))<<( 9 - 4 );
    *out += base;
    out++;
    *out = ( (*in) >>  4  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  13  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  22  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  31  ) ;
    ++in;
    *out |= ((*in) % (1U<< 8 ))<<( 9 - 8 );
    *out += base;
    out++;
    *out = ( (*in) >>  8  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  17  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 3 ))<<( 9 - 3 );
    *out += base;
    out++;
    *out = ( (*in) >>  3  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  12  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  21  )   % (1U << 9 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 7 ))<<( 9 - 7 );
    *out += base;
    out++;
    *out = ( (*in) >>  7  )   % (1U << 9 )  ;
    *out += base;
    out++;

    return in + 1;
}